

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

int SoapySDRDevice_writeSetting(SoapySDRDevice *device,char *key,char *value)

{
  undefined1 *puVar1;
  allocator local_49;
  char *local_48;
  string local_40;
  
  local_48 = value;
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string((string *)&local_40,key,&local_49);
  SoapySDR::Device::writeSetting<char_const*>((Device *)device,&local_40,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int SoapySDRDevice_writeSetting(SoapySDRDevice *device, const char *key, const char *value)
{
    __SOAPY_SDR_C_TRY
    device->writeSetting(key, value);
    __SOAPY_SDR_C_CATCH
}